

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O2

int __thiscall bhf::ads::SymbolAccess::Write<float>(SymbolAccess *this,SymbolEntry *entry,string *v)

{
  long lVar1;
  code *pcVar2;
  ostream *poVar3;
  int iVar4;
  undefined4 local_35c;
  string local_358;
  stringstream converter;
  long local_328 [2];
  byte abStack_318 [360];
  stringstream stream_1;
  ostream local_1a0 [376];
  
  if (v->_M_string_length == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&converter);
    poVar3 = std::operator<<((ostream *)local_328,"Write");
    std::operator<<(poVar3,"<T>() empty strings are not supported\n");
    std::__cxx11::stringbuf::str();
    Logger::Log(3,(string *)&stream_1);
    std::__cxx11::string::~string((string *)&stream_1);
    std::__cxx11::stringstream::~stringstream((stringstream *)&converter);
    iVar4 = 0x706;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char *)v,0x136641);
    std::__cxx11::stringstream::stringstream((stringstream *)&converter);
    if (lVar1 == -1) {
      pcVar2 = std::dec;
    }
    else {
      pcVar2 = std::hex;
    }
    (*pcVar2)((ostream *)local_328 + *(long *)(local_328[0] + -0x18));
    std::operator<<((ostream *)local_328,(string *)v);
    local_35c = 0;
    std::istream::_M_extract<float>((float *)&converter);
    if ((abStack_318[*(long *)(_converter + -0x18)] & 5) == 0) {
      lVar1 = AdsDevice::WriteReqEx
                        (&this->device,(entry->header).iGroup,(entry->header).iOffs,4,&local_35c);
      iVar4 = (int)lVar1;
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream_1);
      poVar3 = std::operator<<(local_1a0,"Write");
      poVar3 = std::operator<<(poVar3,"() parsing \'");
      poVar3 = std::operator<<(poVar3,(string *)v);
      std::operator<<(poVar3,"\' failed\n");
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream_1);
      iVar4 = 0x706;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&converter);
  }
  return iVar4;
}

Assistant:

int SymbolAccess::Write(const SymbolEntry& entry, const std::string& v) const
{
    if (!v.size()) {
        LOG_ERROR(__FUNCTION__ << "<T>() empty strings are not supported\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }

    const auto asHex = (v.npos != v.rfind("0x", 0));
    std::stringstream converter;
    converter << (asHex ? std::hex : std::dec) << v;

    T value = {};
    converter >> value;
    if (converter.fail()) {
        LOG_ERROR(__FUNCTION__ << "() parsing '" << v << "' failed\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }

    value = bhf::ads::htole(value);
    return device.WriteReqEx(entry.header.iGroup,
                             entry.header.iOffs,
                             sizeof(value),
                             &value);
}